

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_v7tar.c
# Opt level: O0

int format_octal(int64_t v,char *p,int s)

{
  char *__src;
  bool local_31;
  char *h;
  int len;
  int s_local;
  char *p_local;
  int64_t v_local;
  
  h._0_4_ = s;
  _len = p;
  if (v < 0) {
    while (0 < (int)h) {
      *_len = '0';
      h._0_4_ = (int)h + -1;
      _len = _len + 1;
    }
    v_local._4_4_ = -1;
  }
  else {
    h._4_4_ = s;
    _len = p + s;
    p_local = (char *)v;
    do {
      __src = _len + -1;
      _len[-1] = ((byte)p_local & 7) + 0x30;
      p_local = (char *)((long)p_local >> 3);
      h._4_4_ = h._4_4_ + -1;
      local_31 = 0 < h._4_4_ && 0 < (long)p_local;
      _len = __src;
    } while (local_31);
    if (p_local == (char *)0x0) {
      memmove(p,__src,(long)(s - h._4_4_));
      _len = p + ((long)s - (long)h._4_4_);
      while (0 < h._4_4_) {
        *_len = ' ';
        h._4_4_ = h._4_4_ + -1;
        _len = _len + 1;
      }
      v_local._4_4_ = 0;
    }
    else {
      while (0 < (int)h) {
        *_len = '7';
        h._0_4_ = (int)h + -1;
        _len = _len + 1;
      }
      v_local._4_4_ = -1;
    }
  }
  return v_local._4_4_;
}

Assistant:

static int
format_octal(int64_t v, char *p, int s)
{
	int len;

	len = s;

	/* Octal values can't be negative, so use 0. */
	if (v < 0) {
		while (len-- > 0)
			*p++ = '0';
		return (-1);
	}

	p += s;		/* Start at the end and work backwards. */
	while (s-- > 0) {
		*--p = (char)('0' + (v & 7));
		v >>= 3;
	}

	if (v == 0)
		return (0);

	/* If it overflowed, fill field with max value. */
	while (len-- > 0)
		*p++ = '7';

	return (-1);
}